

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modalgamepad.cpp
# Opt level: O0

void handleNubClick(NubClickMode mode,int value,Mouse *mouse,UinputDevice *gamepad,
                   Settings *settings)

{
  int __flags;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lk_1;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lk;
  Settings *settings_local;
  UinputDevice *gamepad_local;
  Mouse *mouse_local;
  int value_local;
  NubClickMode mode_local;
  
  __flags = (int)settings;
  lk._M_device = (mutex_type *)settings;
  switch(mode) {
  case UNKNOWN_NUB_CLICK_MODE:
    break;
  case NUB_CLICK_LEFT:
    UinputDevice::send(gamepad,1,(void *)0x13d,(ulong)(uint)value,__flags);
    UinputDevice::send(gamepad,0,(void *)0x0,0,__flags);
    break;
  case NUB_CLICK_RIGHT:
    UinputDevice::send(gamepad,1,(void *)0x13e,(ulong)(uint)value,__flags);
    UinputDevice::send(gamepad,0,(void *)0x0,0,__flags);
    break;
  case MOUSE_LEFT:
    std::lock_guard<std::mutex>::lock_guard(&local_30,&mouse->mutex);
    UinputDevice::send(&mouse->device,1,(void *)0x110,(ulong)(uint)value,__flags);
    UinputDevice::send(&mouse->device,0,(void *)0x0,0,__flags);
    std::lock_guard<std::mutex>::~lock_guard(&local_30);
    break;
  case MOUSE_RIGHT:
    std::lock_guard<std::mutex>::lock_guard(&local_48,&mouse->mutex);
    UinputDevice::send(&mouse->device,1,(void *)0x111,(ulong)(uint)value,__flags);
    UinputDevice::send(&mouse->device,0,(void *)0x0,0,__flags);
    std::lock_guard<std::mutex>::~lock_guard(&local_48);
  }
  return;
}

Assistant:

void handleNubClick(Settings::NubClickMode mode, int value, Mouse* mouse, UinputDevice* gamepad, Settings const& settings)
{
  switch(mode)
  {
    case Settings::MOUSE_LEFT:
      {
        std::lock_guard<std::mutex> lk(mouse->mutex);
        mouse->device.send(EV_KEY, BTN_LEFT, value);
        mouse->device.send(EV_SYN, 0, 0);
        break;
      }
    case Settings::MOUSE_RIGHT:
      {
        std::lock_guard<std::mutex> lk(mouse->mutex);
        mouse->device.send(EV_KEY, BTN_RIGHT, value);
        mouse->device.send(EV_SYN, 0, 0);
        break;
      }
    case Settings::NUB_CLICK_LEFT:
      gamepad->send(EV_KEY, BTN_THUMBL, value);
      gamepad->send(EV_SYN, 0, 0);
      break;
    case Settings::NUB_CLICK_RIGHT:
      gamepad->send(EV_KEY, BTN_THUMBR, value);
      gamepad->send(EV_SYN, 0, 0);
      break;
  case Settings::UNKNOWN_NUB_CLICK_MODE:
      break;
  }
}